

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O3

char * deqp::gls::RandomArrayGenerator::createQuads<deqp::gls::GLValue::Fixed>
                 (int seed,int count,int componentCount,int offset,int stride,Primitive primitive,
                 Fixed min,Fixed max,float gridSize)

{
  int iVar1;
  uint uVar2;
  deUint32 dVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  Fixed FVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  float fVar19;
  deRandom rnd;
  uint local_ac;
  deRandom local_a0;
  ulong local_90;
  ulong local_88;
  int local_7c;
  int local_78;
  int local_74;
  char *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  char *local_40;
  ulong local_38;
  
  uVar14 = componentCount * 4;
  if (stride != 0) {
    uVar14 = stride;
  }
  local_38 = (ulong)(uVar14 * 2);
  iVar6 = uVar14 * 6;
  if (primitive != PRIMITIVE_TRIANGLES) {
    iVar6 = 0;
  }
  local_70 = (char *)operator_new__((long)(iVar6 * count + offset));
  deRandom_init(&local_a0,seed);
  if (primitive == PRIMITIVE_TRIANGLES) {
    fVar19 = (float)max.m_value - (float)min.m_value;
    uVar18 = -(uint)(-fVar19 <= fVar19);
    uVar2 = (uint)((float)(~uVar18 & (uint)-fVar19 | (uint)fVar19 & uVar18) * gridSize * 32768.0);
    uVar18 = 0x800;
    if (0x800 < (int)uVar2) {
      uVar18 = uVar2;
    }
    if (0 < count) {
      local_40 = local_70 + offset;
      uVar2 = max.m_value - min.m_value;
      local_48 = (ulong)(uVar14 * 3);
      local_50 = (ulong)(uVar14 * 4);
      local_58 = (ulong)(uVar14 * 5);
      local_78 = 8;
      local_7c = 0xc;
      local_90 = 0;
      local_88 = (ulong)(uint)componentCount;
      local_68 = (ulong)uVar14;
      local_60 = (ulong)(uint)count;
      do {
        local_ac = 0;
        while( true ) {
          FVar7.m_value = min.m_value;
          if (min.m_value < max.m_value) {
            dVar3 = deRandom_getUint32(&local_a0);
            FVar7.m_value = dVar3 % uVar2 + min.m_value;
          }
          local_74 = FVar7.m_value - FVar7.m_value % (int)uVar18;
          uVar9 = max.m_value - local_74 & 0x7fff;
          uVar10 = uVar9 - uVar18;
          uVar14 = uVar18;
          if (uVar18 <= uVar9 && uVar10 != 0) {
            dVar3 = deRandom_getUint32(&local_a0);
            uVar14 = dVar3 % uVar10 + uVar18;
          }
          FVar7.m_value = min.m_value;
          if (min.m_value < max.m_value) {
            dVar3 = deRandom_getUint32(&local_a0);
            FVar7.m_value = dVar3 % uVar2 + min.m_value;
          }
          iVar11 = FVar7.m_value - FVar7.m_value % (int)uVar18;
          uVar10 = max.m_value - iVar11 & 0x7fff;
          uVar12 = uVar10 - uVar18;
          uVar9 = uVar18;
          if (uVar18 <= uVar10 && uVar12 != 0) {
            dVar3 = deRandom_getUint32(&local_a0);
            uVar9 = dVar3 % uVar12 + uVar18;
          }
          iVar15 = uVar14 - (int)uVar14 % (int)uVar18;
          iVar17 = uVar9 - (int)uVar9 % (int)uVar18;
          iVar13 = (int)local_88;
          if (iVar13 < 3) break;
          if (min.m_value < max.m_value) {
            dVar3 = deRandom_getUint32(&local_a0);
            iVar16 = dVar3 % uVar2 + min.m_value;
            iVar16 = iVar16 - iVar16 % (int)uVar18;
            iVar8 = 1;
            if (iVar13 != 3) {
              dVar3 = deRandom_getUint32(&local_a0);
              iVar8 = dVar3 % uVar2 + min.m_value;
              iVar8 = iVar8 - iVar8 % (int)uVar18;
            }
            iVar13 = (int)local_88;
          }
          else {
            iVar16 = min.m_value - min.m_value % (int)uVar18;
            iVar8 = iVar16;
            if (iVar13 == 3) {
              iVar8 = 1;
            }
          }
          fVar19 = (float)iVar16 + (float)iVar15;
          uVar14 = -(uint)(-fVar19 <= fVar19);
          if ((((float)(int)uVar18 <= (float)(~uVar14 & (uint)-fVar19 | (uint)fVar19 & uVar14)) &&
              (fVar19 = (float)iVar8 + (float)iVar17, uVar14 = -(uint)(-fVar19 <= fVar19),
              (float)(int)uVar18 <= (float)(~uVar14 & (uint)-fVar19 | (uint)fVar19 & uVar14))) ||
             (2 < local_ac)) goto LAB_01855a3a;
          local_ac = local_ac + 1;
        }
        iVar16 = 0;
        iVar8 = 1;
LAB_01855a3a:
        iVar4 = iVar6 * (int)local_90;
        *(int *)(local_40 + iVar4) = local_74;
        *(int *)(local_40 + (iVar4 + 4)) = iVar11;
        iVar1 = (int)local_68;
        iVar15 = iVar15 + local_74;
        *(int *)(local_40 + (iVar4 + iVar1)) = iVar15;
        *(int *)(local_40 + (iVar4 + iVar1 + 4)) = iVar11;
        iVar17 = iVar17 + iVar11;
        *(int *)(local_40 + (iVar4 + (int)local_38)) = local_74;
        *(int *)(local_40 + (iVar4 + (int)local_38 + 4)) = iVar17;
        *(int *)(local_40 + (iVar4 + (int)local_48)) = local_74;
        *(int *)(local_40 + (iVar4 + 4 + (int)local_48)) = iVar17;
        *(int *)(local_40 + (iVar4 + (int)local_50)) = iVar15;
        *(int *)(local_40 + (iVar4 + 4 + (int)local_50)) = iVar11;
        *(int *)(local_40 + (iVar4 + (int)local_58)) = iVar15;
        *(int *)(local_40 + (iVar4 + (int)local_58 + 4)) = iVar17;
        if (2 < iVar13) {
          lVar5 = 6;
          iVar11 = local_78;
          do {
            *(int *)(local_40 + iVar11) = iVar16;
            iVar11 = iVar11 + iVar1;
            lVar5 = lVar5 + -1;
          } while (lVar5 != 0);
          if (iVar13 != 3) {
            lVar5 = 6;
            iVar11 = local_7c;
            do {
              *(int *)(local_40 + iVar11) = iVar8;
              iVar11 = iVar11 + iVar1;
              lVar5 = lVar5 + -1;
            } while (lVar5 != 0);
          }
        }
        local_90 = local_90 + 1;
        local_78 = local_78 + iVar6;
        local_7c = local_7c + iVar6;
      } while (local_90 != local_60);
    }
  }
  return local_70;
}

Assistant:

char* RandomArrayGenerator::createQuads (int seed, int count, int componentCount, int offset, int stride, Array::Primitive primitive, T min, T max, float gridSize)
{
	int componentStride = sizeof(T);
	int quadStride = 0;

	if (stride == 0)
		stride = componentCount * componentStride;

	DE_ASSERT(stride >= componentCount * componentStride);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* resultData = new char[offset + quadStride * count];
	char* _data = resultData;
	resultData = resultData + offset;

	deRandom rnd;
	deRandom_init(&rnd,  seed);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
		{
			const T	minQuadSize	= T::fromFloat(deFloatAbs(max.template to<float>() - min.template to<float>()) * gridSize);
			const T	minDiff		= minValue<T>() > minQuadSize
								? minValue<T>()
								: minQuadSize;

			for (int quadNdx = 0; quadNdx < count; ++quadNdx)
			{
				T x1, x2;
				T y1, y2;
				T z, w;

				// attempt to find a good (i.e not extremely small) quad
				for (int attemptNdx = 0; attemptNdx < 4; ++attemptNdx)
				{
					x1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					x2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - x1)));

					y1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					y2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - y1)));

					z = (componentCount > 2) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(0));
					w = (componentCount > 3) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(1));

					// no additional components, all is good
					if (componentCount <= 2)
						break;

					// The result quad is too thin?
					if ((deFloatAbs(x2.template to<float>() + z.template to<float>()) < minDiff.template to<float>()) ||
						(deFloatAbs(y2.template to<float>() + w.template to<float>()) < minDiff.template to<float>()))
						continue;

					// all ok
					break;
				}

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4 + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5 + componentStride]), y1 + y2);

				if (componentCount > 2)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 2]), z);
				}

				if (componentCount > 3)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 3]), w);
				}
			}

			break;
		}

		default:
			DE_ASSERT(false);
			break;
	}

	return _data;
}